

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev-primality-test.cpp
# Opt level: O3

polynomial * __thiscall
polynomial::operator*(polynomial *__return_storage_ptr__,polynomial *this,polynomial *other)

{
  pointer puVar1;
  uint64_t b;
  uint64_t uVar2;
  pointer puVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  allocator_type local_51;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  size_type local_48;
  polynomial *local_40;
  polynomial *local_38;
  
  puVar3 = (this->p).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar1 = (this->p).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_48 = (long)puVar3 - (long)puVar1 >> 3;
  __return_storage_ptr__->n = this->n;
  local_50 = &__return_storage_ptr__->p;
  local_40 = __return_storage_ptr__;
  local_38 = other;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_50,local_48,&local_51);
  if (puVar3 != puVar1) {
    lVar5 = local_48 + (local_48 == 0);
    puVar3 = (local_50->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      lVar6 = 0;
      do {
        uVar4 = (ulong)(lVar7 + lVar6) % local_48;
        uVar2 = puVar3[uVar4];
        b = gaIMulMod((this->p).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar7],
                      (local_38->p).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar6],this->n);
        uVar2 = gaIAddMod(uVar2,b,this->n);
        puVar3 = (local_50->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        puVar3[uVar4] = uVar2;
        lVar6 = lVar6 + 1;
      } while (lVar5 != lVar6);
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar5);
  }
  return local_40;
}

Assistant:

polynomial operator* (const polynomial& other) {
        uint64_t r = this->p.size();
        polynomial ret(r, n);
        for (int i = 0; i < r; i++) {
            for (int j = 0; j < r; j++) {
                 ret.p[(i+j) % r] = gaIAddMod(ret.p[(i+j) % r], gaIMulMod(this->p[i], other.p[j], this->n), this->n);
            }
        }
        return ret;
    }